

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>
               (GetterFuncPtr *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  ImPlotPoint IVar10;
  ImPlotContext *pIVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  double extraout_XMM1_Qa_01;
  float fVar9;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    iVar3 = getter->Count;
    local_48 = iVar3 + -1;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    IVar10.x = (*getter->Getter)(getter->Data,(getter->Offset % iVar3 + iVar3) % iVar3);
    iVar3 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar3].Min;
    local_3c.y = (float)(GImPlot->My[iVar3] *
                         (extraout_XMM1_Qa_01 - GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) +
                        (double)IVar2.y);
    local_3c.x = (float)(GImPlot->Mx * ((double)IVar10.x - (GImPlot->CurrentPlot->XAxis).Range.Min)
                        + (double)IVar2.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLin> *)local_58,
               DrawList,&pIVar5->CurrentPlot->PlotRect);
  }
  else {
    iVar3 = getter->Count;
    IVar10.x = (*getter->Getter)(getter->Data,(getter->Offset % iVar3 + iVar3) % iVar3);
    iVar3 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar3].Min;
    local_58._4_4_ =
         (float)(GImPlot->My[iVar3] *
                 (extraout_XMM1_Qa - GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y
                );
    local_58._0_4_ =
         (float)(GImPlot->Mx * ((double)IVar10.x - (GImPlot->CurrentPlot->XAxis).Range.Min) +
                (double)IVar2.x);
    iVar3 = getter->Count;
    if (1 < iVar3) {
      iVar6 = 1;
      do {
        IVar10.x = (*getter->Getter)(getter->Data,((getter->Offset + iVar6) % iVar3 + iVar3) % iVar3
                                    );
        iVar3 = transformer->YAxis;
        IVar2 = GImPlot->PixelRange[iVar3].Min;
        fVar7 = (float)(GImPlot->Mx * ((double)IVar10.x - (GImPlot->CurrentPlot->XAxis).Range.Min) +
                       (double)IVar2.x);
        fVar8 = (float)(GImPlot->My[iVar3] *
                        (extraout_XMM1_Qa_00 - GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) +
                       (double)IVar2.y);
        local_60.y = fVar8;
        local_60.x = fVar7;
        pIVar4 = pIVar5->CurrentPlot;
        fVar9 = (float)local_58._4_4_;
        if (fVar8 <= (float)local_58._4_4_) {
          fVar9 = fVar8;
        }
        if ((fVar9 < (pIVar4->PlotRect).Max.y) &&
           (fVar9 = (float)(~-(uint)(fVar8 <= (float)local_58._4_4_) & (uint)fVar8 |
                           local_58._4_4_ & -(uint)(fVar8 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
          fVar9 = (float)local_58._0_4_;
          if (fVar7 <= (float)local_58._0_4_) {
            fVar9 = fVar7;
          }
          if ((fVar9 < (pIVar4->PlotRect).Max.x) &&
             (fVar9 = (float)(-(uint)(fVar7 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar7 <= (float)local_58._0_4_) & (uint)fVar7),
             (pIVar4->PlotRect).Min.x <= fVar9 && fVar9 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar6 = iVar6 + 1;
        iVar3 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar6 < iVar3);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}